

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

ssize_t __thiscall
booster::aio::stream_socket::read(stream_socket *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ssize_t sVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  uint local_30 [2];
  error_category *local_28;
  
  local_30[0] = 0;
  local_28 = (error_category *)std::_V2::system_category();
  sVar2 = read(this,__fd,local_30,__nbytes);
  uVar1 = local_30[0];
  if (local_30[0] == 0) {
    return sVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = local_28;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

size_t stream_socket::read(mutable_buffer const &buf)
{
	system::error_code e;
	size_t n=read(buf,e);
	if(e)
		throw system::system_error(e);
	return n;
}